

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_unencode_gzip_write(connectdata *conn,SingleRequest *k,ssize_t nread)

{
  ssize_t sVar1;
  int iVar2;
  CURLcode CVar3;
  anon_enum_32 aVar4;
  char *__s1;
  void *pvVar5;
  zlibInitState *pzVar6;
  long local_40;
  ssize_t hlen_1;
  ssize_t hlen;
  z_stream *z;
  ssize_t nread_local;
  SingleRequest *k_local;
  connectdata *conn_local;
  
  hlen = (ssize_t)&k->z;
  z = (z_stream *)nread;
  nread_local = (ssize_t)k;
  k_local = (SingleRequest *)conn;
  if (k->zlib_init == ZLIB_UNINIT) {
    memset((void *)hlen,0,0x70);
    *(code **)(hlen + 0x40) = zalloc_cb;
    *(code **)(hlen + 0x48) = zfree_cb;
    __s1 = (char *)zlibVersion();
    iVar2 = strcmp(__s1,"1.2.0.4");
    if (iVar2 < 0) {
      iVar2 = inflateInit2_(hlen,0xfffffff1,"1.2.11",0x70);
      if (iVar2 != 0) {
        CVar3 = process_zlib_error((connectdata *)k_local,(z_stream *)hlen);
        return CVar3;
      }
      *(undefined4 *)(nread_local + 0xd4) = 1;
    }
    else {
      iVar2 = inflateInit2_(hlen,0x2f,"1.2.11",0x70);
      if (iVar2 != 0) {
        CVar3 = process_zlib_error((connectdata *)k_local,(z_stream *)hlen);
        return CVar3;
      }
      *(undefined4 *)(nread_local + 0xd4) = 4;
    }
  }
  iVar2 = (int)z;
  if (*(int *)(nread_local + 0xd4) == 4) {
    *(undefined8 *)hlen = *(undefined8 *)(nread_local + 0x80);
    *(int *)(hlen + 8) = iVar2;
    CVar3 = inflate_stream((connectdata *)k_local,(SingleRequest *)nread_local);
    return CVar3;
  }
  if (*(int *)(nread_local + 0xd4) == 1) {
    aVar4 = check_gzip_header(*(uchar **)(nread_local + 0x80),(ssize_t)z,&hlen_1);
    sVar1 = hlen;
    if (aVar4 != CURLDIGESTALGO_MD5) {
      if ((aVar4 != CURLDIGESTALGO_MD5SESS) && (aVar4 == CURLIOCMD_LAST)) {
        *(int *)(hlen + 8) = (int)z;
        pvVar5 = (*Curl_cmalloc)((size_t)*(undefined4 *)(hlen + 8));
        *(void **)hlen = pvVar5;
        if (*(long *)hlen == 0) {
          CVar3 = exit_zlib((z_stream *)hlen,(zlibInitState *)(nread_local + 0xd4),
                            CURLE_OUT_OF_MEMORY);
          return CVar3;
        }
        memcpy(*(void **)hlen,*(void **)(nread_local + 0x80),(ulong)*(uint *)(hlen + 8));
        *(undefined4 *)(nread_local + 0xd4) = 2;
        return CURLE_OK;
      }
      pzVar6 = (zlibInitState *)(nread_local + 0xd4);
      CVar3 = process_zlib_error((connectdata *)k_local,(z_stream *)hlen);
      CVar3 = exit_zlib((z_stream *)sVar1,pzVar6,CVar3);
      return CVar3;
    }
    *(long *)hlen = *(long *)(nread_local + 0x80) + hlen_1;
    *(int *)(hlen + 8) = (int)z - (int)hlen_1;
    *(undefined4 *)(nread_local + 0xd4) = 3;
  }
  else if (*(int *)(nread_local + 0xd4) == 2) {
    *(int *)(hlen + 8) = iVar2 + *(int *)(hlen + 8);
    pvVar5 = Curl_saferealloc(*(void **)hlen,(ulong)*(uint *)(hlen + 8));
    *(void **)hlen = pvVar5;
    if (*(long *)hlen == 0) {
      CVar3 = exit_zlib((z_stream *)hlen,(zlibInitState *)(nread_local + 0xd4),CURLE_OUT_OF_MEMORY);
      return CVar3;
    }
    memcpy((void *)((*(long *)hlen + (ulong)*(uint *)(hlen + 8)) - (long)z),
           *(void **)(nread_local + 0x80),(size_t)z);
    aVar4 = check_gzip_header(*(uchar **)hlen,(ulong)*(uint *)(hlen + 8),&local_40);
    if (aVar4 != CURLDIGESTALGO_MD5) {
      if ((aVar4 != CURLDIGESTALGO_MD5SESS) && (aVar4 == CURLIOCMD_LAST)) {
        return CURLE_OK;
      }
      (*Curl_cfree)(*(void **)hlen);
      sVar1 = hlen;
      pzVar6 = (zlibInitState *)(nread_local + 0xd4);
      CVar3 = process_zlib_error((connectdata *)k_local,(z_stream *)hlen);
      CVar3 = exit_zlib((z_stream *)sVar1,pzVar6,CVar3);
      return CVar3;
    }
    (*Curl_cfree)(*(void **)hlen);
    *(ulong *)hlen =
         (long)z + ((*(long *)(nread_local + 0x80) + local_40) - (ulong)*(uint *)(hlen + 8));
    *(int *)(hlen + 8) = *(int *)(hlen + 8) - (int)local_40;
    *(undefined4 *)(nread_local + 0xd4) = 3;
  }
  else {
    *(undefined8 *)hlen = *(undefined8 *)(nread_local + 0x80);
    *(int *)(hlen + 8) = iVar2;
  }
  if (*(int *)(hlen + 8) == 0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    conn_local._4_4_ = inflate_stream((connectdata *)k_local,(SingleRequest *)nread_local);
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode
Curl_unencode_gzip_write(struct connectdata *conn,
                         struct SingleRequest *k,
                         ssize_t nread)
{
  z_stream *z = &k->z;          /* zlib state structure */

  /* Initialize zlib? */
  if(k->zlib_init == ZLIB_UNINIT) {
    memset(z, 0, sizeof(z_stream));
    z->zalloc = (alloc_func)zalloc_cb;
    z->zfree = (free_func)zfree_cb;

    if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
      /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
      if(inflateInit2(z, MAX_WBITS+32) != Z_OK) {
        return process_zlib_error(conn, z);
      }
      k->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
    }
    else {
      /* we must parse the gzip header ourselves */
      if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
        return process_zlib_error(conn, z);
      }
      k->zlib_init = ZLIB_INIT;   /* Initial call state */
    }
  }

  if(k->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (Bytef *)k->str;
    z->avail_in = (uInt)nread;
    /* Now uncompress the data */
    return inflate_stream(conn, k);
  }

#ifndef OLD_ZLIB_SUPPORT
  /* Support for old zlib versions is compiled away and we are running with
     an old version, so return an error. */
  return exit_zlib(z, &k->zlib_init, CURLE_WRITE_ERROR);

#else
  /* This next mess is to get around the potential case where there isn't
   * enough data passed in to skip over the gzip header.  If that happens, we
   * malloc a block and copy what we have then wait for the next call.  If
   * there still isn't enough (this is definitely a worst-case scenario), we
   * make the block bigger, copy the next part in and keep waiting.
   *
   * This is only required with zlib versions < 1.2.0.4 as newer versions
   * can handle the gzip header themselves.
   */

  switch(k->zlib_init) {
  /* Skip over gzip header? */
  case ZLIB_INIT:
  {
    /* Initial call state */
    ssize_t hlen;

    switch(check_gzip_header((unsigned char *)k->str, nread, &hlen)) {
    case GZIP_OK:
      z->next_in = (Bytef *)k->str + hlen;
      z->avail_in = (uInt)(nread - hlen);
      k->zlib_init = ZLIB_GZIP_INFLATING; /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We need more data so we can find the end of the gzip header.  It's
       * possible that the memory block we malloc here will never be freed if
       * the transfer abruptly aborts after this point.  Since it's unlikely
       * that circumstances will be right for this code path to be followed in
       * the first place, and it's even more unlikely for a transfer to fail
       * immediately afterwards, it should seldom be a problem.
       */
      z->avail_in = (uInt)nread;
      z->next_in = malloc(z->avail_in);
      if(z->next_in == NULL) {
        return exit_zlib(z, &k->zlib_init, CURLE_OUT_OF_MEMORY);
      }
      memcpy(z->next_in, k->str, z->avail_in);
      k->zlib_init = ZLIB_GZIP_HEADER;   /* Need more gzip header data state */
      /* We don't have any data to inflate yet */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_GZIP_HEADER:
  {
    /* Need more gzip header data state */
    ssize_t hlen;
    z->avail_in += (uInt)nread;
    z->next_in = Curl_saferealloc(z->next_in, z->avail_in);
    if(z->next_in == NULL) {
      return exit_zlib(z, &k->zlib_init, CURLE_OUT_OF_MEMORY);
    }
    /* Append the new block of data to the previous one */
    memcpy(z->next_in + z->avail_in - nread, k->str, nread);

    switch(check_gzip_header(z->next_in, z->avail_in, &hlen)) {
    case GZIP_OK:
      /* This is the zlib stream data */
      free(z->next_in);
      /* Don't point into the malloced block since we just freed it */
      z->next_in = (Bytef *)k->str + hlen + nread - z->avail_in;
      z->avail_in = (uInt)(z->avail_in - hlen);
      k->zlib_init = ZLIB_GZIP_INFLATING;   /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We still don't have any data to inflate! */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      free(z->next_in);
      return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_GZIP_INFLATING:
  default:
    /* Inflating stream state */
    z->next_in = (Bytef *)k->str;
    z->avail_in = (uInt)nread;
    break;
  }

  if(z->avail_in == 0) {
    /* We don't have any data to inflate; wait until next time */
    return CURLE_OK;
  }

  /* We've parsed the header, now uncompress the data */
  return inflate_stream(conn, k);
#endif
}